

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::regionDisplayName
          (LocaleDisplayNamesImpl *this,char *region,UnicodeString *result,UBool skipAdjust)

{
  if (this->nameLength == UDISPCTX_LENGTH_SHORT) {
    ICUDataTable::get(&this->regionData,"Countries%short",(char *)0x0,region,result);
    if ((undefined1  [56])((undefined1  [56])result->fUnion & (undefined1  [56])0x1) ==
        (undefined1  [56])0x0) goto LAB_0029cc24;
  }
  ICUDataTable::get(&this->regionData,"Countries",(char *)0x0,region,result);
LAB_0029cc24:
  if (skipAdjust == '\0') {
    adjustForUsageAndContext(this,kCapContextUsageTerritory,result);
  }
  return result;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::regionDisplayName(const char* region,
                                          UnicodeString& result,
                                          UBool skipAdjust) const {
    if (nameLength == UDISPCTX_LENGTH_SHORT) {
        regionData.get("Countries%short", region, result);
        if (!result.isBogus()) {
            return skipAdjust? result: adjustForUsageAndContext(kCapContextUsageTerritory, result);
        }
    }
    regionData.get("Countries", region, result);
    return skipAdjust? result: adjustForUsageAndContext(kCapContextUsageTerritory, result);
}